

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O2

int ConvolutionReverb::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  int iVar1;
  EffectData *pEVar2;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<ConvolutionReverb::EffectData>(state);
  if (index < 0xb) {
    if (value != (float *)0x0) {
      *value = pEVar2->p[index];
    }
    iVar1 = 0;
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }